

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::calc_line_starts(Fl_Text_Display *this,int startLine,int endLine)

{
  int *piVar1;
  ulong uVar2;
  int startPos;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int nextLineStart;
  int lineEnd;
  int local_38;
  int local_34;
  
  iVar5 = this->mNVisibleLines;
  if (endLine < 1) {
    endLine = 0;
  }
  if (iVar5 <= endLine) {
    endLine = iVar5 - 1U;
  }
  uVar4 = 0;
  if (0 < startLine) {
    uVar4 = startLine;
  }
  if (iVar5 <= (int)uVar4) {
    uVar4 = iVar5 - 1U;
  }
  uVar6 = (ulong)uVar4;
  if ((int)uVar4 <= endLine) {
    iVar5 = this->mBuffer->mLength;
    piVar1 = this->mLineStarts;
    if (uVar4 == 0) {
      *piVar1 = this->mFirstChar;
      uVar6 = 1;
    }
    uVar2 = (ulong)(int)uVar6;
    if ((piVar1[uVar2 - 1] != -1) && ((int)uVar6 <= endLine)) {
      lVar3 = uVar2 << 0x20;
      uVar6 = uVar2;
      startPos = piVar1[uVar2 - 1];
      do {
        find_line_end(this,startPos,true,&local_34,&local_38);
        if (iVar5 <= local_38) {
          if ((uVar6 == 0) ||
             ((*(int *)((long)piVar1 + (lVar3 >> 0x1e) + -4) != iVar5 && (local_34 != local_38)))) {
            *(int *)((long)piVar1 + (lVar3 >> 0x1e)) = iVar5;
            uVar6 = (ulong)((int)uVar6 + 1);
          }
          break;
        }
        piVar1[uVar6] = local_38;
        uVar6 = uVar6 + 1;
        lVar3 = lVar3 + 0x100000000;
        startPos = local_38;
      } while (endLine + 1U != (int)uVar6);
    }
    iVar5 = (int)uVar6;
    if (iVar5 <= endLine) {
      memset(piVar1 + iVar5,0xff,(ulong)(uint)(endLine - iVar5) * 4 + 4);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::calc_line_starts( int startLine, int endLine ) {
  int startPos, bufLen = mBuffer->length();
  int line, lineEnd, nextLineStart, nVis = mNVisibleLines;
  int *lineStarts = mLineStarts;

  /* Clean up (possibly) messy input parameters */
  if ( endLine < 0 ) endLine = 0;
  if ( endLine >= nVis ) endLine = nVis - 1;
  if ( startLine < 0 ) startLine = 0;
  if ( startLine >= nVis ) startLine = nVis - 1;
  if ( startLine > endLine )
    return;

  /* Find the last known good line number -> position mapping */
  if ( startLine == 0 ) {
    lineStarts[ 0 ] = mFirstChar;
    startLine = 1;
  }
  startPos = lineStarts[ startLine - 1 ];

  /* If the starting position is already past the end of the text,
   fill in -1's (means no text on line) and return */
  if ( startPos == -1 ) {
    for ( line = startLine; line <= endLine; line++ )
      lineStarts[ line ] = -1;
    return;
  }

  /* Loop searching for ends of lines and storing the positions of the
   start of the next line in lineStarts */
  for ( line = startLine; line <= endLine; line++ ) {
    find_line_end(startPos, true, &lineEnd, &nextLineStart);
    startPos = nextLineStart;
    if ( startPos >= bufLen ) {
      /* If the buffer ends with a newline or line break, put
       buf->length() in the next line start position (instead of
       a -1 which is the normal marker for an empty line) to
       indicate that the cursor may safely be displayed there */
      if ( line == 0 || ( lineStarts[ line - 1 ] != bufLen &&
                         lineEnd != nextLineStart ) ) {
        lineStarts[ line ] = bufLen;
        line++;
      }
      break;
    }
    lineStarts[ line ] = startPos;
  }

  /* Set any entries beyond the end of the text to -1 */
  for ( ; line <= endLine; line++ )
    lineStarts[ line ] = -1;
}